

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

GLuint __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramAttacher::getAttachment
          (ShaderProgramAttacher *this,GLuint program)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int ndx;
  long lVar2;
  GLint shaderType;
  GLsizei numShaders;
  GLuint shaders [2];
  
  shaders[0] = 0;
  shaders[1] = 0;
  numShaders = 0;
  iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x778))(program,2,&numShaders,shaders);
  lVar2 = 0;
  while( true ) {
    iVar1 = numShaders;
    if (1 < numShaders) {
      iVar1 = 2;
    }
    if (iVar1 <= lVar2) break;
    shaderType = 0;
    iVar1 = (*((this->super_Attacher).super_ContextWrapper.m_ctx.m_renderCtx)->_vptr_RenderContext
              [3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xa70))(shaders[lVar2],0x8b4f,&shaderType);
    if (shaderType == 0x8b30) {
      return shaders[lVar2];
    }
    lVar2 = lVar2 + 1;
  }
  return 0;
}

Assistant:

GLuint ShaderProgramAttacher::getAttachment (GLuint program)
{
	GLuint			shaders[2]	= { 0, 0 };
	const GLsizei	shadersLen	= DE_LENGTH_OF_ARRAY(shaders);
	GLsizei			numShaders	= 0;
	GLuint			ret			= 0;

	gl().getAttachedShaders(program, shadersLen, &numShaders, shaders);

	// There should ever be at most one attached shader in normal use, but if
	// something is wrong, the temporary vertex shader might not have been
	// detached properly, so let's find the fragment shader explicitly.
	for (int ndx = 0; ndx < de::min<GLsizei>(shadersLen, numShaders); ++ndx)
	{
		GLint shaderType = GL_NONE;
		gl().getShaderiv(shaders[ndx], GL_SHADER_TYPE, &shaderType);

		if (shaderType == GL_FRAGMENT_SHADER)
		{
			ret = shaders[ndx];
			break;
		}
	}

	return ret;
}